

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha-1.c
# Opt level: O2

uchar * lws_SHA1(uchar *d,size_t n,uchar *md)

{
  undefined1 local_78 [24];
  anon_union_8_2_c95872b5_for_c aStack_60;
  anon_union_64_2_c9586734_for_m local_58;
  undefined8 local_18;
  
  aStack_60 = (anon_union_8_2_c95872b5_for_c)0x0;
  local_58._48_8_ = 0;
  local_58._56_8_ = 0;
  local_58._32_8_ = 0;
  local_58._40_8_ = 0;
  local_58._16_8_ = 0;
  local_58._24_8_ = 0;
  local_18._0_1_ = '\0';
  local_18._1_7_ = 0;
  local_58._0_8_ = 0;
  local_58._8_8_ = 0;
  local_78._0_8_ = 0xefcdab8967452301;
  local_78._8_8_ = 0x1032547698badcfe;
  local_78._16_8_ = 0xc3d2e1f0;
  sha1_loop((sha1_ctxt *)local_78,d,n);
  sha1_result((sha1_ctxt *)local_78,md);
  return md;
}

Assistant:

unsigned char *
lws_SHA1(const unsigned char *d, size_t n, unsigned char *md)
{
	struct sha1_ctxt ctx;

	_sha1_init(&ctx);
	sha1_loop(&ctx, d, n);
	sha1_result(&ctx, (void *)md);

	return md;
}